

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

bool DoSpawnDecal(AActor *actor,FDecalTemplate *tpl,int flags,DAngle *angle,double zofs,
                 double distance)

{
  sector_t *sec;
  FDecalTemplate *tpl_00;
  FDecalTemplate *basisactor;
  DBaseDecal *pDVar1;
  double x;
  double y;
  double dVar2;
  double dVar3;
  double dVar4;
  TAngle<double> local_48;
  TAngle<double> local_40;
  double local_38;
  double distance_local;
  double zofs_local;
  DAngle *angle_local;
  FDecalTemplate *pFStack_18;
  int flags_local;
  FDecalTemplate *tpl_local;
  AActor *actor_local;
  
  local_38 = distance;
  distance_local = zofs;
  zofs_local = (double)angle;
  angle_local._4_4_ = flags;
  pFStack_18 = tpl;
  tpl_local = (FDecalTemplate *)actor;
  if ((flags & 1U) == 0) {
    TAngle<double>::TAngle(&local_40,&(actor->Angles).Yaw);
    TAngle<double>::operator+=(angle,&local_40);
  }
  basisactor = tpl_local;
  tpl_00 = pFStack_18;
  sec = (sector_t *)tpl_local[2].ScaleX;
  x = AActor::X((AActor *)tpl_local);
  y = AActor::Y((AActor *)tpl_local);
  dVar2 = AActor::Center((AActor *)tpl_local);
  dVar4 = *(double *)&tpl_local[5].super_FDecalBase.Users.Most;
  dVar3 = AActor::GetBobOffset((AActor *)tpl_local,0.0);
  dVar4 = (dVar2 - dVar4) + dVar3 + distance_local;
  TAngle<double>::TAngle(&local_48,angle);
  pDVar1 = ShootDecal(tpl_00,(AActor *)basisactor,sec,x,y,dVar4,&local_48,local_38,
                      (angle_local._4_4_ & 2) != 0);
  return pDVar1 != (DBaseDecal *)0x0;
}

Assistant:

static bool DoSpawnDecal(AActor *actor, const FDecalTemplate *tpl, int flags, DAngle angle, double zofs, double distance)
{
	if (!(flags & SDF_ABSANGLE))
	{
		angle += actor->Angles.Yaw;
	}
	return NULL != ShootDecal(tpl, actor, actor->Sector, actor->X(), actor->Y(),
		actor->Center() - actor->Floorclip + actor->GetBobOffset() + zofs,
		angle, distance, !!(flags & SDF_PERMANENT));
}